

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O2

void __thiscall QOpenGLTextureCache::~QOpenGLTextureCache(QOpenGLTextureCache *this)

{
  ~QOpenGLTextureCache(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

QOpenGLTextureCache::~QOpenGLTextureCache()
{
}